

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

statement_base * __thiscall
cs::method_try::translate
          (method_try *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  undefined8 uVar4;
  statement_base *this_00;
  statement_base **ptr;
  iterator __end1;
  iterator __begin1;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *__range1;
  bool founded;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> cbody;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> tbody;
  string name;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> body;
  _Self *in_stack_fffffffffffffc68;
  compiler_type *in_stack_fffffffffffffc70;
  _Self *in_stack_fffffffffffffc78;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_fffffffffffffc80;
  allocator *paVar5;
  element_type *in_stack_fffffffffffffcc0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffcc8;
  context_t *in_stack_fffffffffffffcd0;
  allocator_type *in_stack_fffffffffffffcd8;
  _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
  *in_stack_fffffffffffffce0;
  _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
  *in_stack_fffffffffffffce8;
  statement_try *in_stack_fffffffffffffcf0;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_stack_fffffffffffffd28;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_stack_fffffffffffffd30;
  string local_290 [38];
  undefined1 local_26a;
  allocator local_269;
  string local_268 [32];
  reference local_248;
  _Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**> local_220;
  undefined1 *local_200;
  byte local_1f1;
  string local_150 [232];
  undefined1 local_68 [104];
  
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)0x24042c);
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x240439);
  std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x240441);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::begin((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           *)in_stack_fffffffffffffc68);
  std::operator+(in_stack_fffffffffffffc78,(difference_type)in_stack_fffffffffffffc70);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::end((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         *)in_stack_fffffffffffffc68);
  std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>::allocator
            ((allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> *)0x2404a8
            );
  std::
  deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
  ::
  deque<std::_Deque_iterator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const&,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const*>,void>
            ((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
              *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
             in_stack_fffffffffffffcd8);
  compiler_type::translate
            (in_stack_fffffffffffffc70,
             (deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
              *)in_stack_fffffffffffffc68,
             (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)0x2404e0);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
            *)in_stack_fffffffffffffcc0);
  std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>::~allocator
            ((allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> *)0x2404fc
            );
  std::__cxx11::string::string(local_150);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)0x240516);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)0x240525);
  local_1f1 = 0;
  local_200 = local_68;
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::begin
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
             in_stack_fffffffffffffc68);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::end
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
             in_stack_fffffffffffffc68);
  while (bVar1 = std::operator!=((_Self *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68),
        bVar1) {
    local_248 = std::
                _Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>
                ::operator*(&local_220);
    iVar2 = (*(*local_248)->_vptr_statement_base[2])();
    if (iVar2 == 0x1b) {
      psVar3 = statement_catch::get_name_abi_cxx11_((statement_catch *)*local_248);
      std::__cxx11::string::operator=(local_150,(string *)psVar3);
      local_1f1 = 1;
    }
    else if ((local_1f1 & 1) == 0) {
      std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::push_back
                ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
                 in_stack_fffffffffffffc70,(value_type *)in_stack_fffffffffffffc68);
    }
    else {
      std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::push_back
                ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
                 in_stack_fffffffffffffc70,(value_type *)in_stack_fffffffffffffc68);
    }
    std::_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>::
    operator++((_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>
                *)in_stack_fffffffffffffc70);
  }
  if ((local_1f1 & 1) != 0) {
    this_00 = (statement_base *)statement_base::operator_new((size_t)in_stack_fffffffffffffc70);
    std::__cxx11::string::string(local_290,local_150);
    std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
              (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
              (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    std::shared_ptr<cs::context_type>::shared_ptr
              ((shared_ptr<cs::context_type> *)this_00,
               (shared_ptr<cs::context_type> *)&stack0xfffffffffffffcc0);
    std::
    deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
    ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
             *)in_stack_fffffffffffffc80);
    std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::back(in_stack_fffffffffffffc80)
    ;
    statement_try::statement_try
              (in_stack_fffffffffffffcf0,(string *)in_stack_fffffffffffffce8,
               (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
               in_stack_fffffffffffffce0,
               (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
               in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
               (token_base *)in_stack_fffffffffffffcc8._M_pi);
    std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x240874);
    std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~deque
              ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
               in_stack_fffffffffffffcc0);
    std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~deque
              ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
               in_stack_fffffffffffffcc0);
    std::__cxx11::string::~string(local_290);
    std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~deque
              ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
               in_stack_fffffffffffffcc0);
    std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~deque
              ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
               in_stack_fffffffffffffcc0);
    std::__cxx11::string::~string(local_150);
    std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~deque
              ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
               in_stack_fffffffffffffcc0);
    return this_00;
  }
  local_26a = 1;
  uVar4 = __cxa_allocate_exception(0x28);
  paVar5 = &local_269;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_268,"Wrong grammar for try statement, expect catch statement.",paVar5);
  compile_error::compile_error
            ((compile_error *)in_stack_fffffffffffffc70,(string *)in_stack_fffffffffffffc68);
  local_26a = 0;
  __cxa_throw(uVar4,&compile_error::typeinfo,compile_error::~compile_error);
}

Assistant:

statement_base *method_try::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		std::deque<statement_base *> body;
		context->compiler->translate({raw.begin() + 1, raw.end()}, body);
		std::string name;
		std::deque<statement_base *> tbody, cbody;
		bool founded = false;
		for (auto &ptr: body) {
			if (ptr->get_type() == statement_types::catch_) {
				name = static_cast<statement_catch *>(ptr)->get_name();
				founded = true;
				continue;
			}
			if (founded)
				cbody.push_back(ptr);
			else
				tbody.push_back(ptr);
		}
		if (!founded)
			throw compile_error("Wrong grammar for try statement, expect catch statement.");
		return new statement_try(name, tbody, cbody, context, raw.front().back());
	}